

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O1

void __thiscall
dlib::con_<64l,1l,1l,1,1,0,0>::
backward<dlib::dimpl::subnet_wrapper<dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,true,void>>
          (con_<64l,1l,1l,1,1,0,0> *this,tensor *gradient_input,
          subnet_wrapper<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_true,_void>
          *sub,tensor *params_grad)

{
  tensor *ptVar1;
  tensor *data;
  alias_tensor_instance filt;
  alias_tensor_instance b;
  alias_tensor_instance local_c0;
  alias_tensor_instance local_78;
  
  alias_tensor::operator()(&local_c0,(alias_tensor *)(this + 0x98),(tensor *)this,0);
  ptVar1 = add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>::get_gradient_input(sub->l);
  cpu::tensor_conv::get_gradient_for_data
            ((tensor_conv *)(this + 0x128),true,gradient_input,&local_c0.super_tensor,ptVar1);
  if ((*(double *)(this + 0x148) != 0.0) || (NAN(*(double *)(this + 0x148)))) {
    alias_tensor::operator()(&local_c0,(alias_tensor *)(this + 0x98),params_grad,0);
    ptVar1 = sub->l->cached_output_ptr;
    data = &(sub->l->cached_output).super_tensor;
    if (ptVar1 != (tensor *)0x0) {
      data = ptVar1;
    }
    cpu::tensor_conv::get_gradient_for_filters
              ((tensor_conv *)(this + 0x128),false,gradient_input,data,&local_c0.super_tensor);
    if (this[0x178] == (con_<64l,1l,1l,1,1,0,0>)0x1) {
      alias_tensor::operator()
                (&local_78,(alias_tensor *)(this + 0xe0),params_grad,*(size_t *)(this + 0xc0));
      tt::assign_conv_bias_gradient(&local_78.super_tensor,gradient_input);
    }
  }
  return;
}

Assistant:

void backward(const tensor& gradient_input, SUBNET& sub, tensor& params_grad)
        {
            conv.get_gradient_for_data (true, gradient_input, filters(params,0), sub.get_gradient_input());
            // no point computing the parameter gradients if they won't be used.
            if (learning_rate_multiplier != 0)
            {
                auto filt = filters(params_grad,0);
                conv.get_gradient_for_filters (false, gradient_input, sub.get_output(), filt);
                if (use_bias)
                {
                    auto b = biases(params_grad, filters.size());
                    tt::assign_conv_bias_gradient(b, gradient_input);
                }
            }
        }